

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

index_t __thiscall xLearn::OndiskReader::Samples(OndiskReader *this,DMatrix **matrix)

{
  DMatrix *pDVar1;
  Parser *pPVar2;
  index_t iVar3;
  Reader *this_00;
  size_t len;
  size_t ret;
  
  this_00 = (Reader *)this->file_ptr_;
  len = (this->super_Reader).block_size_ << 0x14;
  ret = ReadDataFromDisk((FILE *)this_00,(this->super_Reader).block_,len);
  if (ret == 0) {
    *matrix = (DMatrix *)0x0;
    iVar3 = 0;
  }
  else {
    if (ret == len) {
      Reader::shrink_block(this_00,(this->super_Reader).block_,&ret,this->file_ptr_);
    }
    pPVar2 = (this->super_Reader).parser_;
    pDVar1 = &(this->super_Reader).data_samples_;
    (*pPVar2->_vptr_Parser[2])(pPVar2,(this->super_Reader).block_,ret,pDVar1,1);
    *matrix = pDVar1;
    iVar3 = (this->super_Reader).data_samples_.row_length;
  }
  return iVar3;
}

Assistant:

index_t OndiskReader::Samples(DMatrix* &matrix) {
  // Convert MB to Byte
  uint64 read_byte = block_size_ * 1024 * 1024;
  // Read a block of data from disk file
  size_t ret = ReadDataFromDisk(file_ptr_, block_, read_byte);
  if (ret == 0) {
    matrix = nullptr;
    return 0;
  } else if (ret == read_byte) {
    // Find the last '\n', and shrink back file pointer
    shrink_block(block_, &ret, file_ptr_);
  } // else ret < read_byte: we don't need shrink_block()
  // Parse block to data_sample_
  parser_->Parse(block_, ret, data_samples_, true);
  matrix = &data_samples_;
  return data_samples_.row_length;
}